

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlFdWrite(void *context,char *buffer,int len)

{
  int __fd;
  bool bVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  
  if (len < 1) {
    iVar5 = 0;
  }
  else {
    __fd = *context;
    iVar5 = 0;
    do {
      sVar3 = write(__fd,buffer,(ulong)(uint)len);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 0) {
        piVar4 = __errno_location();
        iVar5 = xmlIOErr(*piVar4);
        return -iVar5;
      }
      iVar5 = iVar5 + uVar2;
      buffer = buffer + (uVar2 & 0x7fffffff);
      uVar6 = len - uVar2;
      bVar1 = (int)uVar2 <= len;
      len = uVar6;
    } while (uVar6 != 0 && bVar1);
  }
  return iVar5;
}

Assistant:

static int
xmlFdWrite(void *context, const char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
	bytes = write(fd, buffer, len);
	if (bytes < 0)
            return(-xmlIOErr(errno));
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}